

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::OP_SetNativeIntElementI
               (Var instance,Var aElementIndex,int32 iValue,ScriptContext *scriptContext,
               PropertyOperationFlags flags)

{
  long lVar1;
  bool bVar2;
  uint32 indexInt;
  BOOL BVar3;
  JavascriptArray *this;
  
  lVar1 = *instance;
  bVar2 = TaggedInt::Is(aElementIndex);
  if (bVar2) {
    indexInt = TaggedInt::ToInt32(aElementIndex);
    if (-1 < (int)indexInt) {
      bVar2 = ScriptContextOptimizationOverrideInfo::IsEnabledArraySetElementFastPath
                        (&scriptContext->optimizationOverrides);
      if (bVar2) {
        this = (JavascriptArray *)VarTo<Js::JavascriptNativeIntArray>(instance);
        BVar3 = JavascriptArray::TryGrowHeadSegmentAndSetItem<int,Js::JavascriptNativeIntArray>
                          (this,indexInt,iValue);
        if (BVar3 == 0) {
          JavascriptNativeIntArray::SetItem((JavascriptNativeIntArray *)this,indexInt,iValue);
        }
        goto LAB_0099e74e;
      }
    }
  }
  OP_SetElementI(instance,aElementIndex,(Var)((ulong)(uint)iValue | 0x1000000000000),scriptContext,
                 flags);
LAB_0099e74e:
  return (uint)(lVar1 != *instance);
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeIntElementI(
        Var instance,
        Var aElementIndex,
        int32 iValue,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeIntElementI);

        INT_PTR vt = (INT_PTR)nullptr;
        vt = VirtualTableInfoBase::GetVirtualTable(instance);

        if (TaggedInt::Is(aElementIndex))
        {
            int32 indexInt = TaggedInt::ToInt32(aElementIndex);
            if (indexInt >= 0 && scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                JavascriptNativeIntArray *arr = VarTo<JavascriptNativeIntArray>(instance);
                if (!(arr->TryGrowHeadSegmentAndSetItem<int32, JavascriptNativeIntArray>((uint32)indexInt, iValue)))
                {
                    arr->SetItem(indexInt, iValue);
                }
                return vt != VirtualTableInfoBase::GetVirtualTable(instance);
            }
        }

        JavascriptOperators::OP_SetElementI(instance, aElementIndex, JavascriptNumber::ToVar(iValue, scriptContext), scriptContext, flags);
        return vt != VirtualTableInfoBase::GetVirtualTable(instance);
        JIT_HELPER_END(Op_SetNativeIntElementI);
    }